

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void pd_forwardmess(t_pd *x,int argc,t_atom *argv)

{
  t_atomtype tVar1;
  t_atomtype t;
  t_atom *argv_local;
  int argc_local;
  t_pd *x_local;
  
  if (argc != 0) {
    tVar1 = argv->a_type;
    if (tVar1 == A_SYMBOL) {
      pd_typedmess(x,(argv->a_w).w_symbol,argc + -1,argv + 1);
    }
    else if (tVar1 == A_POINTER) {
      if (argc == 1) {
        pd_pointer(x,(argv->a_w).w_gpointer);
      }
      else {
        pd_list(x,&s_list,argc,argv);
      }
    }
    else if (tVar1 == A_FLOAT) {
      if (argc == 1) {
        pd_float(x,(argv->a_w).w_float);
      }
      else {
        pd_list(x,&s_list,argc,argv);
      }
    }
    else {
      bug("pd_forwardmess");
    }
  }
  return;
}

Assistant:

void pd_forwardmess(t_pd *x, int argc, t_atom *argv)
{
    if (argc)
    {
        t_atomtype t = argv->a_type;
        if (t == A_SYMBOL) pd_typedmess(x, argv->a_w.w_symbol, argc-1, argv+1);
        else if (t == A_POINTER)
        {
            if (argc == 1) pd_pointer(x, argv->a_w.w_gpointer);
            else pd_list(x, &s_list, argc, argv);
        }
        else if (t == A_FLOAT)
        {
            if (argc == 1) pd_float(x, argv->a_w.w_float);
            else pd_list(x, &s_list, argc, argv);
        }
        else bug("pd_forwardmess");
    }

}